

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::updateEditorData(QAbstractItemView *this)

{
  long in_FS_OFFSET;
  QModelIndex local_38;
  QModelIndex local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.r = -1;
  local_20.c = -1;
  local_20.i = 0;
  local_20.m.ptr = (QAbstractItemModel *)0x0;
  local_38.r = -1;
  local_38.c = -1;
  local_38.i = 0;
  local_38.m.ptr = (QAbstractItemModel *)0x0;
  QAbstractItemViewPrivate::updateEditorData
            (*(QAbstractItemViewPrivate **)(this + 8),&local_20,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::updateEditorData()
{
    Q_D(QAbstractItemView);
    d->updateEditorData(QModelIndex(), QModelIndex());
}